

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O1

int alsa_init(cubeb_conflict1 **context,char *context_name)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  cubeb_conflict1 *__arg;
  snd_config_t *psVar4;
  pthread_mutex_t *pcm_name;
  long lVar5;
  snd_pcm_t *dummy;
  int fd [2];
  pthread_attr_t attr;
  snd_pcm_t *local_68;
  undefined8 local_60;
  pthread_attr_t local_58;
  
  if (context == (cubeb_conflict1 **)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                  ,0x33c,"int alsa_init(cubeb **, const char *)");
  }
  *context = (cubeb_conflict1 *)0x0;
  pvVar3 = (void *)dlopen("libasound.so.2",1);
  if ((pvVar3 != (void *)0x0) || (pvVar3 = (void *)dlopen("libasound.so",1), pvVar3 != (void *)0x0))
  {
    cubeb_snd_config = (snd_config_t **)dlsym(pvVar3,"snd_config");
    if ((((cubeb_snd_config != (snd_config_t **)0x0) &&
         (((cubeb_snd_config_add =
                 (_func_int_snd_config_t_ptr_snd_config_t_ptr *)dlsym(pvVar3,"snd_config_add"),
           cubeb_snd_config_add != (_func_int_snd_config_t_ptr_snd_config_t_ptr *)0x0 &&
           (cubeb_snd_config_copy =
                 (_func_int_snd_config_t_ptr_ptr_snd_config_t_ptr *)dlsym(pvVar3,"snd_config_copy"),
           cubeb_snd_config_copy != (_func_int_snd_config_t_ptr_ptr_snd_config_t_ptr *)0x0)) &&
          (cubeb_snd_config_delete = (_func_int_snd_config_t_ptr *)dlsym(pvVar3,"snd_config_delete")
          , cubeb_snd_config_delete != (_func_int_snd_config_t_ptr *)0x0)))) &&
        (((cubeb_snd_config_get_id =
                (_func_int_snd_config_t_ptr_char_ptr_ptr *)dlsym(pvVar3,"snd_config_get_id"),
          cubeb_snd_config_get_id != (_func_int_snd_config_t_ptr_char_ptr_ptr *)0x0 &&
          (cubeb_snd_config_get_string =
                (_func_int_snd_config_t_ptr_char_ptr_ptr *)dlsym(pvVar3,"snd_config_get_string"),
          cubeb_snd_config_get_string != (_func_int_snd_config_t_ptr_char_ptr_ptr *)0x0)) &&
         (cubeb_snd_config_imake_integer =
               (_func_int_snd_config_t_ptr_ptr_char_ptr_long *)
               dlsym(pvVar3,"snd_config_imake_integer"),
         cubeb_snd_config_imake_integer != (_func_int_snd_config_t_ptr_ptr_char_ptr_long *)0x0))))
       && ((((cubeb_snd_config_search =
                   (_func_int_snd_config_t_ptr_char_ptr_snd_config_t_ptr_ptr *)
                   dlsym(pvVar3,"snd_config_search"),
             cubeb_snd_config_search !=
             (_func_int_snd_config_t_ptr_char_ptr_snd_config_t_ptr_ptr *)0x0 &&
             (cubeb_snd_config_search_definition =
                   (_func_int_snd_config_t_ptr_char_ptr_char_ptr_snd_config_t_ptr_ptr *)
                   dlsym(pvVar3,"snd_config_search_definition"),
             cubeb_snd_config_search_definition !=
             (_func_int_snd_config_t_ptr_char_ptr_char_ptr_snd_config_t_ptr_ptr *)0x0)) &&
            ((cubeb_snd_lib_error_set_handler =
                   (_func_int_snd_lib_error_handler_t *)dlsym(pvVar3,"snd_lib_error_set_handler"),
             cubeb_snd_lib_error_set_handler != (_func_int_snd_lib_error_handler_t *)0x0 &&
             (((((cubeb_snd_pcm_avail_update =
                       (_func_snd_pcm_sframes_t_snd_pcm_t_ptr *)dlsym(pvVar3,"snd_pcm_avail_update")
                 , cubeb_snd_pcm_avail_update != (_func_snd_pcm_sframes_t_snd_pcm_t_ptr *)0x0 &&
                 (cubeb_snd_pcm_close = (_func_int_snd_pcm_t_ptr *)dlsym(pvVar3,"snd_pcm_close"),
                 cubeb_snd_pcm_close != (_func_int_snd_pcm_t_ptr *)0x0)) &&
                (cubeb_snd_pcm_delay =
                      (_func_int_snd_pcm_t_ptr_snd_pcm_sframes_t_ptr *)dlsym(pvVar3,"snd_pcm_delay")
                , cubeb_snd_pcm_delay != (_func_int_snd_pcm_t_ptr_snd_pcm_sframes_t_ptr *)0x0)) &&
               ((cubeb_snd_pcm_drain = (_func_int_snd_pcm_t_ptr *)dlsym(pvVar3,"snd_pcm_drain"),
                cubeb_snd_pcm_drain != (_func_int_snd_pcm_t_ptr *)0x0 &&
                (cubeb_snd_pcm_frames_to_bytes =
                      (_func_ssize_t_snd_pcm_t_ptr_snd_pcm_sframes_t *)
                      dlsym(pvVar3,"snd_pcm_frames_to_bytes"),
                cubeb_snd_pcm_frames_to_bytes !=
                (_func_ssize_t_snd_pcm_t_ptr_snd_pcm_sframes_t *)0x0)))) &&
              (cubeb_snd_pcm_get_params =
                    (_func_int_snd_pcm_t_ptr_snd_pcm_uframes_t_ptr_snd_pcm_uframes_t_ptr *)
                    dlsym(pvVar3,"snd_pcm_get_params"),
              cubeb_snd_pcm_get_params !=
              (_func_int_snd_pcm_t_ptr_snd_pcm_uframes_t_ptr_snd_pcm_uframes_t_ptr *)0x0)))))) &&
           (((cubeb_snd_pcm_hw_params_any =
                   (_func_int_snd_pcm_t_ptr_snd_pcm_hw_params_t_ptr *)
                   dlsym(pvVar3,"snd_pcm_hw_params_any"),
             cubeb_snd_pcm_hw_params_any != (_func_int_snd_pcm_t_ptr_snd_pcm_hw_params_t_ptr *)0x0
             && (cubeb_snd_pcm_hw_params_get_channels_max =
                      (_func_int_snd_pcm_hw_params_t_ptr_uint_ptr *)
                      dlsym(pvVar3,"snd_pcm_hw_params_get_channels_max"),
                cubeb_snd_pcm_hw_params_get_channels_max !=
                (_func_int_snd_pcm_hw_params_t_ptr_uint_ptr *)0x0)) &&
            ((((cubeb_snd_pcm_hw_params_get_rate =
                     (_func_int_snd_pcm_hw_params_t_ptr_uint_ptr_int_ptr *)
                     dlsym(pvVar3,"snd_pcm_hw_params_get_rate"),
               cubeb_snd_pcm_hw_params_get_rate !=
               (_func_int_snd_pcm_hw_params_t_ptr_uint_ptr_int_ptr *)0x0 &&
               (((((cubeb_snd_pcm_hw_params_set_rate_near =
                         (_func_int_snd_pcm_t_ptr_snd_pcm_hw_params_t_ptr_uint_ptr_int_ptr *)
                         dlsym(pvVar3,"snd_pcm_hw_params_set_rate_near"),
                   cubeb_snd_pcm_hw_params_set_rate_near !=
                   (_func_int_snd_pcm_t_ptr_snd_pcm_hw_params_t_ptr_uint_ptr_int_ptr *)0x0 &&
                   (cubeb_snd_pcm_hw_params_sizeof =
                         (_func_size_t *)dlsym(pvVar3,"snd_pcm_hw_params_sizeof"),
                   cubeb_snd_pcm_hw_params_sizeof != (_func_size_t *)0x0)) &&
                  (cubeb_snd_pcm_nonblock =
                        (_func_int_snd_pcm_t_ptr_int *)dlsym(pvVar3,"snd_pcm_nonblock"),
                  cubeb_snd_pcm_nonblock != (_func_int_snd_pcm_t_ptr_int *)0x0)) &&
                 (((cubeb_snd_pcm_open =
                         (_func_int_snd_pcm_t_ptr_ptr_char_ptr_snd_pcm_stream_t_int *)
                         dlsym(pvVar3,"snd_pcm_open"),
                   cubeb_snd_pcm_open !=
                   (_func_int_snd_pcm_t_ptr_ptr_char_ptr_snd_pcm_stream_t_int *)0x0 &&
                   (cubeb_snd_pcm_open_lconf =
                         (_func_int_snd_pcm_t_ptr_ptr_char_ptr_snd_pcm_stream_t_int_snd_config_t_ptr
                          *)dlsym(pvVar3,"snd_pcm_open_lconf"),
                   cubeb_snd_pcm_open_lconf !=
                   (_func_int_snd_pcm_t_ptr_ptr_char_ptr_snd_pcm_stream_t_int_snd_config_t_ptr *)0x0
                   )) && ((cubeb_snd_pcm_pause =
                                (_func_int_snd_pcm_t_ptr_int *)dlsym(pvVar3,"snd_pcm_pause"),
                          cubeb_snd_pcm_pause != (_func_int_snd_pcm_t_ptr_int *)0x0 &&
                          ((cubeb_snd_pcm_poll_descriptors =
                                 (_func_int_snd_pcm_t_ptr_pollfd_ptr_uint *)
                                 dlsym(pvVar3,"snd_pcm_poll_descriptors"),
                           cubeb_snd_pcm_poll_descriptors !=
                           (_func_int_snd_pcm_t_ptr_pollfd_ptr_uint *)0x0 &&
                           (cubeb_snd_pcm_poll_descriptors_count =
                                 (_func_int_snd_pcm_t_ptr *)
                                 dlsym(pvVar3,"snd_pcm_poll_descriptors_count"),
                           cubeb_snd_pcm_poll_descriptors_count != (_func_int_snd_pcm_t_ptr *)0x0)))
                          ))))) &&
                (cubeb_snd_pcm_poll_descriptors_revents =
                      (_func_int_snd_pcm_t_ptr_pollfd_ptr_uint_unsigned_short_ptr *)
                      dlsym(pvVar3,"snd_pcm_poll_descriptors_revents"),
                cubeb_snd_pcm_poll_descriptors_revents !=
                (_func_int_snd_pcm_t_ptr_pollfd_ptr_uint_unsigned_short_ptr *)0x0)))) &&
              (((cubeb_snd_pcm_readi =
                      (_func_snd_pcm_sframes_t_snd_pcm_t_ptr_void_ptr_snd_pcm_uframes_t *)
                      dlsym(pvVar3,"snd_pcm_readi"),
                cubeb_snd_pcm_readi !=
                (_func_snd_pcm_sframes_t_snd_pcm_t_ptr_void_ptr_snd_pcm_uframes_t *)0x0 &&
                (cubeb_snd_pcm_recover =
                      (_func_int_snd_pcm_t_ptr_int_int *)dlsym(pvVar3,"snd_pcm_recover"),
                cubeb_snd_pcm_recover != (_func_int_snd_pcm_t_ptr_int_int *)0x0)) &&
               (cubeb_snd_pcm_set_params =
                     (_func_int_snd_pcm_t_ptr_snd_pcm_format_t_snd_pcm_access_t_uint_uint_int_uint *
                     )dlsym(pvVar3,"snd_pcm_set_params"),
               cubeb_snd_pcm_set_params !=
               (_func_int_snd_pcm_t_ptr_snd_pcm_format_t_snd_pcm_access_t_uint_uint_int_uint *)0x0))
              )) && (((cubeb_snd_pcm_start =
                            (_func_int_snd_pcm_t_ptr *)dlsym(pvVar3,"snd_pcm_start"),
                      cubeb_snd_pcm_start != (_func_int_snd_pcm_t_ptr *)0x0 &&
                      (cubeb_snd_pcm_state =
                            (_func_snd_pcm_state_t_snd_pcm_t_ptr *)dlsym(pvVar3,"snd_pcm_state"),
                      cubeb_snd_pcm_state != (_func_snd_pcm_state_t_snd_pcm_t_ptr *)0x0)) &&
                     (cubeb_snd_pcm_writei =
                           (_func_snd_pcm_sframes_t_snd_pcm_t_ptr_void_ptr_snd_pcm_uframes_t *)
                           dlsym(pvVar3,"snd_pcm_writei"),
                     cubeb_snd_pcm_writei !=
                     (_func_snd_pcm_sframes_t_snd_pcm_t_ptr_void_ptr_snd_pcm_uframes_t *)0x0))))))))
          )) {
      pthread_mutex_lock((pthread_mutex_t *)&cubeb_alsa_mutex);
      if (cubeb_alsa_error_handler_set == '\0') {
        (*cubeb_snd_lib_error_set_handler)(silent_error_handler);
        cubeb_alsa_error_handler_set = '\x01';
      }
      pthread_mutex_unlock((pthread_mutex_t *)&cubeb_alsa_mutex);
      __arg = (cubeb_conflict1 *)calloc(1,0xf8);
      if (__arg == (cubeb_conflict1 *)0x0) {
        __assert_fail("ctx",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                      ,0x35d,"int alsa_init(cubeb **, const char *)");
      }
      __arg->ops = &alsa_ops;
      __arg->libasound = pvVar3;
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&__arg->mutex,(pthread_mutexattr_t *)0x0);
      if (iVar1 != 0) {
        __assert_fail("r == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                      ,0x363,"int alsa_init(cubeb **, const char *)");
      }
      iVar1 = pipe((int *)&local_60);
      if (iVar1 != 0) {
        __assert_fail("r == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                      ,0x366,"int alsa_init(cubeb **, const char *)");
      }
      lVar5 = 0;
      do {
        iVar1 = *(int *)((long)&local_60 + lVar5 * 4);
        uVar2 = fcntl(iVar1,1);
        fcntl(iVar1,2,(ulong)(uVar2 | 1));
        iVar1 = *(int *)((long)&local_60 + lVar5 * 4);
        uVar2 = fcntl(iVar1,3);
        fcntl(iVar1,4,(ulong)(uVar2 | 0x800));
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      __arg->control_fd_read = (undefined4)local_60;
      __arg->control_fd_write = local_60._4_4_;
      __arg->rebuild = 1;
      iVar1 = pthread_attr_init(&local_58);
      if (iVar1 != 0) {
        __assert_fail("r == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                      ,0x375,"int alsa_init(cubeb **, const char *)");
      }
      iVar1 = pthread_attr_setstacksize(&local_58,0x40000);
      if (iVar1 != 0) {
        __assert_fail("r == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                      ,0x378,"int alsa_init(cubeb **, const char *)");
      }
      iVar1 = pthread_create(&__arg->thread,&local_58,alsa_run_thread,__arg);
      if (iVar1 == 0) {
        iVar1 = pthread_attr_destroy(&local_58);
        if (iVar1 == 0) {
          iVar1 = alsa_locked_pcm_open
                            (&local_68,"default",SND_PCM_STREAM_PLAYBACK,(snd_config_t *)0x0);
          if (-1 < iVar1) {
            alsa_locked_pcm_close(local_68);
          }
          __arg->is_pa = 0;
          pcm_name = &cubeb_alsa_mutex;
          pthread_mutex_lock((pthread_mutex_t *)&cubeb_alsa_mutex);
          psVar4 = init_local_config_with_workaround(pcm_name->__size);
          __arg->local_config = psVar4;
          pthread_mutex_unlock((pthread_mutex_t *)&cubeb_alsa_mutex);
          if (__arg->local_config != (snd_config_t *)0x0) {
            __arg->is_pa = 1;
            iVar1 = alsa_locked_pcm_open
                              (&local_68,"default",SND_PCM_STREAM_PLAYBACK,__arg->local_config);
            if (iVar1 == -0x16) {
              pthread_mutex_lock((pthread_mutex_t *)&cubeb_alsa_mutex);
              (*cubeb_snd_config_delete)(__arg->local_config);
              pthread_mutex_unlock((pthread_mutex_t *)&cubeb_alsa_mutex);
              __arg->local_config = (snd_config_t *)0x0;
            }
            else if (-1 < iVar1) {
              alsa_locked_pcm_close(local_68);
            }
          }
          *context = __arg;
          return 0;
        }
        __assert_fail("r == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                      ,0x37e,"int alsa_init(cubeb **, const char *)");
      }
      __assert_fail("r == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                    ,0x37b,"int alsa_init(cubeb **, const char *)");
    }
    dlclose(pvVar3);
  }
  return -1;
}

Assistant:

int
alsa_init(cubeb ** context, char const * context_name)
{
  (void)context_name;
  void * libasound = NULL;
  cubeb * ctx;
  int r;
  int i;
  int fd[2];
  pthread_attr_t attr;
  snd_pcm_t * dummy;

  assert(context);
  *context = NULL;

#ifndef DISABLE_LIBASOUND_DLOPEN
  libasound = dlopen("libasound.so.2", RTLD_LAZY);
  if (!libasound) {
    libasound = dlopen("libasound.so", RTLD_LAZY);
    if (!libasound) {
      return CUBEB_ERROR;
    }
  }

#define LOAD(x)                                                                \
  {                                                                            \
    cubeb_##x = dlsym(libasound, #x);                                          \
    if (!cubeb_##x) {                                                          \
      dlclose(libasound);                                                      \
      return CUBEB_ERROR;                                                      \
    }                                                                          \
  }

  LIBASOUND_API_VISIT(LOAD);
#undef LOAD
#endif

  pthread_mutex_lock(&cubeb_alsa_mutex);
  if (!cubeb_alsa_error_handler_set) {
    WRAP(snd_lib_error_set_handler)(silent_error_handler);
    cubeb_alsa_error_handler_set = 1;
  }
  pthread_mutex_unlock(&cubeb_alsa_mutex);

  ctx = calloc(1, sizeof(*ctx));
  assert(ctx);

  ctx->ops = &alsa_ops;
  ctx->libasound = libasound;

  r = pthread_mutex_init(&ctx->mutex, NULL);
  assert(r == 0);

  r = pipe(fd);
  assert(r == 0);

  for (i = 0; i < 2; ++i) {
    fcntl(fd[i], F_SETFD, fcntl(fd[i], F_GETFD) | FD_CLOEXEC);
    fcntl(fd[i], F_SETFL, fcntl(fd[i], F_GETFL) | O_NONBLOCK);
  }

  ctx->control_fd_read = fd[0];
  ctx->control_fd_write = fd[1];

  /* Force an early rebuild when alsa_run is first called to ensure fds and
     nfds have been initialized. */
  ctx->rebuild = 1;

  r = pthread_attr_init(&attr);
  assert(r == 0);

  r = pthread_attr_setstacksize(&attr, 256 * 1024);
  assert(r == 0);

  r = pthread_create(&ctx->thread, &attr, alsa_run_thread, ctx);
  assert(r == 0);

  r = pthread_attr_destroy(&attr);
  assert(r == 0);

  /* Open a dummy PCM to force the configuration space to be evaluated so that
     init_local_config_with_workaround can find and modify the default node. */
  r = alsa_locked_pcm_open(&dummy, CUBEB_ALSA_PCM_NAME, SND_PCM_STREAM_PLAYBACK,
                           NULL);
  if (r >= 0) {
    alsa_locked_pcm_close(dummy);
  }
  ctx->is_pa = 0;
  pthread_mutex_lock(&cubeb_alsa_mutex);
  ctx->local_config = init_local_config_with_workaround(CUBEB_ALSA_PCM_NAME);
  pthread_mutex_unlock(&cubeb_alsa_mutex);
  if (ctx->local_config) {
    ctx->is_pa = 1;
    r = alsa_locked_pcm_open(&dummy, CUBEB_ALSA_PCM_NAME,
                             SND_PCM_STREAM_PLAYBACK, ctx->local_config);
    /* If we got a local_config, we found a PA PCM.  If opening a PCM with that
       config fails with EINVAL, the PA PCM is too old for this workaround. */
    if (r == -EINVAL) {
      pthread_mutex_lock(&cubeb_alsa_mutex);
      WRAP(snd_config_delete)(ctx->local_config);
      pthread_mutex_unlock(&cubeb_alsa_mutex);
      ctx->local_config = NULL;
    } else if (r >= 0) {
      alsa_locked_pcm_close(dummy);
    }
  }

  *context = ctx;

  return CUBEB_OK;
}